

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

PipeThread * __thiscall
kj::anon_unknown_0::AsyncIoProviderImpl::newPipeThread
          (PipeThread *__return_storage_ptr__,AsyncIoProviderImpl *this,
          Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)> *startFunc)

{
  AsyncIoStream *this_00;
  int osErrorNumber;
  void *pvVar1;
  Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)> *pFVar2;
  Own<kj::Thread,_std::nullptr_t> *other;
  Own<kj::AsyncIoStream,_std::nullptr_t> *other_00;
  Type *func;
  Type local_c0;
  undefined1 local_a8 [8];
  Own<kj::Thread,_std::nullptr_t> thread;
  Own<kj::AsyncIoStream,_std::nullptr_t> pipe;
  undefined1 local_78 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:2019:5)>
  _kjDefer2019;
  UnwindDetector _kjUnwindDetector2019;
  int threadFd;
  Fault local_48;
  Fault f;
  SyscallResult local_30;
  undefined1 local_2c [4];
  SyscallResult _kjSyscallResult;
  int type;
  int fds [2];
  Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)> *startFunc_local;
  AsyncIoProviderImpl *this_local;
  
  memset(&_kjSyscallResult,0,8);
  local_2c = (undefined1  [4])0x80801;
  f.exception = (Exception *)local_2c;
  local_30 = kj::_::Debug::
             syscall<kj::(anonymous_namespace)::AsyncIoProviderImpl::newPipeThread(kj::Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)>)::_lambda()_1_>
                       ((anon_class_16_2_63434d86 *)&f,false);
  pvVar1 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_30);
  if (pvVar1 != (void *)0x0) {
    this_00 = (AsyncIoStream *)((long)&_kjDefer2019.maybeFunc.ptr.field_1 + 0xc);
    UnwindDetector::UnwindDetector((UnwindDetector *)this_00);
    pipe.ptr = this_00;
    defer<kj::(anonymous_namespace)::AsyncIoProviderImpl::newPipeThread(kj::Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)>)::_lambda()_2_>
              ((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:2019:5)>
                *)local_78,(kj *)&pipe.ptr,func);
    (*this->lowLevel->_vptr_LowLevelAsyncIoProvider[2])
              (&thread.ptr,this->lowLevel,(ulong)(uint)_kjSyscallResult.errorNumber,7);
    pFVar2 = mv<kj::Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)>>
                       (startFunc);
    Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)>::Function
              (&local_c0.startFunc,pFVar2);
    heap<kj::Thread,kj::(anonymous_namespace)::AsyncIoProviderImpl::newPipeThread(kj::Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)>)::_lambda()_3_>
              ((kj *)local_a8,&local_c0);
    kj::(anonymous_namespace)::AsyncIoProviderImpl::
    newPipeThread(kj::Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)>)::
    {lambda()#3}::~Function((_lambda___3_ *)&local_c0);
    other = mv<kj::Own<kj::Thread,decltype(nullptr)>>((Own<kj::Thread,_std::nullptr_t> *)local_a8);
    Own<kj::Thread,_std::nullptr_t>::Own(&__return_storage_ptr__->thread,other);
    other_00 = mv<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
                         ((Own<kj::AsyncIoStream,_std::nullptr_t> *)&thread.ptr);
    Own<kj::AsyncIoStream,_std::nullptr_t>::Own(&__return_storage_ptr__->pipe,other_00);
    Own<kj::Thread,_std::nullptr_t>::~Own((Own<kj::Thread,_std::nullptr_t> *)local_a8);
    Own<kj::AsyncIoStream,_std::nullptr_t>::~Own
              ((Own<kj::AsyncIoStream,_std::nullptr_t> *)&thread.ptr);
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:2019:5)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:2019:5)>
                 *)local_78);
    return __return_storage_ptr__;
  }
  osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_30);
  kj::_::Debug::Fault::Fault
            (&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x7e0,osErrorNumber,"socketpair(AF_UNIX, type, 0, fds)","");
  kj::_::Debug::Fault::fatal(&local_48);
}

Assistant:

PipeThread newPipeThread(
      Function<void(AsyncIoProvider&, AsyncIoStream&, WaitScope&)> startFunc) override {
    int fds[2]{};
    int type = SOCK_STREAM;
#if __linux__ && !__BIONIC__
    type |= SOCK_NONBLOCK | SOCK_CLOEXEC;
#endif
    KJ_SYSCALL(socketpair(AF_UNIX, type, 0, fds));

    int threadFd = fds[1];
    KJ_ON_SCOPE_FAILURE(close(threadFd));

    auto pipe = lowLevel.wrapSocketFd(fds[0], NEW_FD_FLAGS);

    auto thread = heap<Thread>([threadFd,startFunc=kj::mv(startFunc)]() mutable {
      UnixEventPort eventPort;
      EventLoop eventLoop(eventPort);
      WaitScope waitScope(eventLoop);
      LowLevelAsyncIoProviderImpl lowLevel(eventPort);
      auto stream = lowLevel.wrapSocketFd(threadFd, NEW_FD_FLAGS);
      AsyncIoProviderImpl ioProvider(lowLevel);
      startFunc(ioProvider, *stream, waitScope);
    });

    return { kj::mv(thread), kj::mv(pipe) };
  }